

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesnetworkpython.cpp
# Opt level: O1

void __thiscall PythonModuleClient::recv_quit(PythonModuleClient *this)

{
  undefined4 uVar1;
  int iVar2;
  long *plVar3;
  override recv_quit;
  long *local_20;
  
  uVar1 = PyGILState_Ensure();
  boost::python::converter::registration::get_class_object
            (boost::python::converter::detail::registered_base<AbstractModuleClient_const_volatile&>
             ::converters);
  boost::python::detail::wrapper_base::get_override
            ((char *)&local_20,(_typeobject *)&this->super_wrapper<AbstractModuleClient>);
  iVar2 = PyObject_IsTrue(local_20);
  if (iVar2 < 0) {
    boost::python::throw_error_already_set();
  }
  if (iVar2 == 0) {
    *local_20 = *local_20 + -1;
    if (*local_20 == 0) {
      _Py_Dealloc();
    }
  }
  else {
    plVar3 = (long *)PyEval_CallFunction(local_20,"()");
    if (plVar3 == (long *)0x0) {
      boost::python::throw_error_already_set();
    }
    else {
      *plVar3 = *plVar3 + -1;
      if (*plVar3 == 0) {
        _Py_Dealloc(plVar3);
      }
    }
    *local_20 = *local_20 + -1;
    if (*local_20 == 0) {
      _Py_Dealloc();
    }
  }
  PyGILState_Release(uVar1);
  return;
}

Assistant:

void recv_quit(){
        PyLockGIL lock;
        if(override recv_quit = this->get_override("recv_quit")){
            try{
                recv_quit();
            }
            catch (const error_already_set&){
                std::cout << "Exception in recv_quit in application";
                PyErr_Print();
            }
            return;
        }
        AbstractModuleClient::recv_quit();
    }